

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

int lws_buflist_aware_finished_consuming(lws *wsi,lws_tokens *ebuf,int used,int buffered,char *hint)

{
  char cVar1;
  lws_context *plVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  if (used != 0 || buffered == 0) {
    if (used == 0 || buffered == 0) {
      iVar4 = ebuf->len - used;
      iVar5 = 0;
      if (iVar4 != 0) {
        plVar2 = wsi->context;
        cVar1 = wsi->tsi;
        iVar4 = lws_buflist_append_segment(&wsi->buflist,ebuf->token + used,(long)iVar4);
        if (iVar4 < 0) {
          iVar5 = 1;
        }
        else if (iVar4 != 0) {
          iVar5 = 0;
          _lws_log(0x10,"%s: added %p to rxflow list\n","lws_buflist_aware_finished_consuming",wsi);
          if ((wsi->dll_buflist).owner == (lws_dll2_owner *)0x0) {
            lws_dll2_add_head(&wsi->dll_buflist,&plVar2->pt[cVar1].dll_buflist_owner);
          }
        }
      }
    }
    else {
      if ((wsi->buflist != (lws_buflist *)0x0) &&
         (sVar3 = lws_buflist_use_segment(&wsi->buflist,(long)used), (int)sVar3 != 0)) {
        return 0;
      }
      _lws_log(8,"%s: removed %p from dll_buflist\n","lws_buflist_aware_finished_consuming",wsi);
      lws_dll2_remove(&wsi->dll_buflist);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int
lws_buflist_aware_finished_consuming(struct lws *wsi, struct lws_tokens *ebuf,
				     int used, int buffered, const char *hint)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	int m;

	//lwsl_debug("%s %s consuming buffered %d used %zu / %zu\n", __func__, hint,
	//		buffered, (size_t)used, (size_t)ebuf->len);
	// lws_buflist_describe(&wsi->buflist, wsi, __func__);

	/* it's in the buflist; we didn't use any */

	if (!used && buffered)
		return 0;

	if (used && buffered) {
		if (wsi->buflist) {
			m = (int)lws_buflist_use_segment(&wsi->buflist, (size_t)used);
			// lwsl_notice("%s: used %d, next %d\n", __func__, used, m);
			// lws_buflist_describe(&wsi->buflist, wsi, __func__);
			if (m)
				return 0;
		}

		lwsl_info("%s: removed %p from dll_buflist\n", __func__, wsi);
		lws_dll2_remove(&wsi->dll_buflist);

		return 0;
	}

	/* any remainder goes on the buflist */

	if (used != ebuf->len) {
		// lwsl_notice("%s %s bac appending %d\n", __func__, hint,
		//		ebuf->len - used);
		m = lws_buflist_append_segment(&wsi->buflist,
					       ebuf->token + used,
					       ebuf->len - used);
		if (m < 0)
			return 1; /* OOM */
		if (m) {
			lwsl_debug("%s: added %p to rxflow list\n",
				   __func__, wsi);
			if (lws_dll2_is_detached(&wsi->dll_buflist))
				lws_dll2_add_head(&wsi->dll_buflist,
					 &pt->dll_buflist_owner);
		}
		// lws_buflist_describe(&wsi->buflist, wsi, __func__);
	}

	return 0;
}